

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::chooseSimplexStrategyThreads(HEkk *this,HighsOptions *options,HighsSimplexInfo *info)

{
  __type _Var1;
  uint uVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  HighsInt max_threads;
  HighsInt simplex_max_concurrency;
  HighsInt simplex_min_concurrency;
  HighsInt *simplex_strategy;
  uint local_28;
  uint local_24;
  size_type *local_20;
  
  local_20 = &in_RDX[0x15]._M_string_length;
  *(undefined4 *)local_20 = *(undefined4 *)&in_RSI[0xb].field_0x4;
  if ((int)*local_20 == 0) {
    if (*(int *)((long)&in_RDX[0x1b].field_2 + 8) < 1) {
      *(undefined4 *)local_20 = 4;
    }
    else {
      *(undefined4 *)local_20 = 1;
    }
  }
  *(undefined4 *)((long)&in_RDX[0x1e].field_2 + 4) = 1;
  *(undefined4 *)((long)&in_RDX[0x1e].field_2 + 0xc) = 1;
  local_24 = *(uint *)(in_RSI + 0xc);
  local_28 = *(uint *)&in_RSI[0xc].field_0x4;
  uVar2 = ::highs::parallel::num_threads();
  _Var1 = std::operator==(in_RSI,in_RDX);
  if (((_Var1) && ((int)*local_20 == 1)) && (0 < (int)uVar2)) {
    *(int *)local_20 = 3;
  }
  if ((int)*local_20 == 2) {
    piVar3 = std::max<int>(&kDualTasksMinConcurrency,(int *)&local_24);
    *(int *)((long)&in_RDX[0x1e].field_2 + 4) = *piVar3;
    piVar3 = std::max<int>((int *)(in_RDX[0x1e].field_2._M_local_buf + 4),(int *)&local_28);
    *(int *)((long)&in_RDX[0x1e].field_2 + 0xc) = *piVar3;
  }
  else if ((int)*local_20 == 3) {
    piVar3 = std::max<int>(&kDualMultiMinConcurrency,(int *)&local_24);
    *(int *)((long)&in_RDX[0x1e].field_2 + 4) = *piVar3;
    piVar3 = std::max<int>((int *)(in_RDX[0x1e].field_2._M_local_buf + 4),(int *)&local_28);
    *(int *)((long)&in_RDX[0x1e].field_2 + 0xc) = *piVar3;
  }
  *(undefined4 *)((long)&in_RDX[0x1e].field_2 + 8) =
       *(undefined4 *)((long)&in_RDX[0x1e].field_2 + 0xc);
  if (*(int *)((long)&in_RDX[0x1e].field_2 + 8) < (int)local_24) {
    highsLogUser((HighsLogOptions *)(in_RSI + 0x1c),kWarning,
                 "Using concurrency of %d for parallel strategy rather than minimum number (%d) specified in options\n"
                 ,(ulong)*(uint *)((long)&in_RDX[0x1e].field_2 + 8),(ulong)local_24);
  }
  if ((int)local_28 < *(int *)((long)&in_RDX[0x1e].field_2 + 8)) {
    highsLogUser((HighsLogOptions *)(in_RSI + 0x1c),kWarning,
                 "Using concurrency of %d for parallel strategy rather than maximum number (%d) specified in options\n"
                 ,(ulong)*(uint *)((long)&in_RDX[0x1e].field_2 + 8),(ulong)local_28);
  }
  if ((int)uVar2 < *(int *)((long)&in_RDX[0x1e].field_2 + 8)) {
    highsLogUser((HighsLogOptions *)(in_RSI + 0x1c),kWarning,
                 "Number of threads available = %d < %d = Simplex concurrency to be used: Parallel performance may be less than anticipated\n"
                 ,(ulong)uVar2,(ulong)*(uint *)((long)&in_RDX[0x1e].field_2 + 8));
  }
  return;
}

Assistant:

void HEkk::chooseSimplexStrategyThreads(const HighsOptions& options,
                                        HighsSimplexInfo& info) {
  // Ensure that this is not called with an optimal basis
  assert(info.num_dual_infeasibilities > 0 ||
         info.num_primal_infeasibilities > 0);
  // Set the internal simplex strategy and number of threads for dual
  // simplex
  HighsInt& simplex_strategy = info.simplex_strategy;
  // By default, use the HighsOptions strategy. If this is
  // kSimplexStrategyChoose, then the strategy used will depend on
  // whether the current basis is primal feasible.
  simplex_strategy = options.simplex_strategy;
  if (simplex_strategy == kSimplexStrategyChoose) {
    // HiGHS is left to choose the simplex strategy
    if (info.num_primal_infeasibilities > 0) {
      // Not primal feasible, so use dual simplex
      simplex_strategy = kSimplexStrategyDual;
    } else {
      // Primal feasible. so use primal simplex
      simplex_strategy = kSimplexStrategyPrimal;
    }
  }
  // Set min/max_threads to correspond to serial code. They will be
  // set to other values if parallel options are used.
  info.min_concurrency = 1;
  info.max_concurrency = 1;
  // Record the min/max minimum concurrency in the options
  const HighsInt simplex_min_concurrency = options.simplex_min_concurrency;
  const HighsInt simplex_max_concurrency = options.simplex_max_concurrency;
  HighsInt max_threads = highs::parallel::num_threads();

  if (options.parallel == kHighsOnString &&
      simplex_strategy == kSimplexStrategyDual) {
    // The parallel strategy is on and the simplex strategy is dual so use
    // PAMI if there are enough threads
    if (max_threads >= kDualMultiMinConcurrency)
      simplex_strategy = kSimplexStrategyDualMulti;
  }
  //
  // If parallel strategies are used, the minimum concurrency will be
  // set to be at least the minimum required for the strategy
  //
  // All this is independent of the number of threads available, since
  // code with multiple concurrency can be run in serial.

  if (simplex_strategy == kSimplexStrategyDualTasks) {
    info.min_concurrency =
        max(kDualTasksMinConcurrency, simplex_min_concurrency);
    info.max_concurrency = max(info.min_concurrency, simplex_max_concurrency);
  } else if (simplex_strategy == kSimplexStrategyDualMulti) {
    info.min_concurrency =
        max(kDualMultiMinConcurrency, simplex_min_concurrency);
    info.max_concurrency = max(info.min_concurrency, simplex_max_concurrency);
  }

  // Set the concurrency to be used to be the maximum number
  info.num_concurrency = info.max_concurrency;
  // Give a warning if the concurrency to be used is less than the
  // minimum concurrency allowed
  if (info.num_concurrency < simplex_min_concurrency) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Using concurrency of %" HIGHSINT_FORMAT
                 " for parallel strategy rather than "
                 "minimum number (%" HIGHSINT_FORMAT ") specified in options\n",
                 info.num_concurrency, simplex_min_concurrency);
  }
  // Give a warning if the concurrency to be used is more than the
  // maximum concurrency allowed
  if (info.num_concurrency > simplex_max_concurrency) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Using concurrency of %" HIGHSINT_FORMAT
                 " for parallel strategy rather than "
                 "maximum number (%" HIGHSINT_FORMAT ") specified in options\n",
                 info.num_concurrency, simplex_max_concurrency);
  }
  // Give a warning if the concurrency to be used is less than the
  // number of threads available
  if (info.num_concurrency > max_threads) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Number of threads available = %" HIGHSINT_FORMAT
                 " < %" HIGHSINT_FORMAT
                 " = Simplex concurrency to be used: Parallel performance may "
                 "be less than anticipated\n",
                 max_threads, info.num_concurrency);
  }
}